

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateDefinition.cpp
# Opt level: O2

Clause * __thiscall
Shell::PredicateDefinition::replacePurePredicates(PredicateDefinition *this,Clause *cl)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 in_RAX;
  uint i;
  ulong uVar3;
  bool val;
  undefined8 uStack_38;
  
  uVar1 = *(undefined8 *)&cl->field_0x38;
  uVar3 = 0;
  uStack_38 = in_RAX;
  do {
    if (((uint)uVar1 & 0xfffff) == uVar3) {
      return cl;
    }
    uStack_38 = CONCAT44((cl->_literals[uVar3]->super_Term)._functor,(undefined4)uStack_38);
    bVar2 = Lib::DHMap<unsigned_int,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      (&this->_purePreds,(uint *)((long)&uStack_38 + 4),
                       (bool *)((long)&uStack_38 + 3));
    uVar3 = uVar3 + 1;
  } while (!bVar2);
  return (Clause *)0x0;
}

Assistant:

Clause* PredicateDefinition::replacePurePredicates(Clause* cl)
{
  unsigned clen=cl->length();
  for(unsigned i=0;i<clen;i++) {
    bool val;
    if(_purePreds.find((*cl)[i]->functor(), val)) {
      ASS_EQ((*cl)[i]->isPositive(), val);
      return 0;
    }
  }
  return cl;
}